

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

cmMakefile * __thiscall cmGlobalGenerator::FindMakefile(cmGlobalGenerator *this,string *start_dir)

{
  bool bVar1;
  __type _Var2;
  reference ppcVar3;
  char *pcVar4;
  allocator local_51;
  undefined1 local_50 [8];
  string sd;
  __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
  local_28;
  const_iterator it;
  string *start_dir_local;
  cmGlobalGenerator *this_local;
  
  it._M_current = (cmMakefile **)start_dir;
  local_28._M_current =
       (cmMakefile **)
       std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::begin(&this->Makefiles);
  while( true ) {
    sd.field_2._8_8_ =
         std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::end(&this->Makefiles);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                        *)((long)&sd.field_2 + 8));
    if (!bVar1) {
      return (cmMakefile *)0x0;
    }
    ppcVar3 = __gnu_cxx::
              __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
              ::operator*(&local_28);
    pcVar4 = cmMakefile::GetCurrentSourceDirectory(*ppcVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_50,pcVar4,&local_51);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)it._M_current);
    if (_Var2) {
      ppcVar3 = __gnu_cxx::
                __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
                ::operator*(&local_28);
      this_local = (cmGlobalGenerator *)*ppcVar3;
    }
    std::__cxx11::string::~string((string *)local_50);
    if (_Var2) break;
    __gnu_cxx::
    __normal_iterator<cmMakefile_*const_*,_std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>_>
    ::operator++(&local_28);
  }
  return (cmMakefile *)this_local;
}

Assistant:

cmMakefile*
cmGlobalGenerator::FindMakefile(const std::string& start_dir) const
{
  for(std::vector<cmMakefile*>::const_iterator it =
      this->Makefiles.begin(); it != this->Makefiles.end(); ++it)
    {
    std::string sd = (*it)->GetCurrentSourceDirectory();
    if (sd == start_dir)
      {
      return *it;
      }
    }
  return 0;
}